

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::OnReturnCallIndirectExpr
          (BinaryReaderIR *this,Index sig_index,Index table_index)

{
  Result RVar1;
  Expr *local_f8;
  _Head_base<0UL,_wabt::Expr_*,_false> local_f0;
  Location local_e8;
  Var local_c0;
  Var local_78;
  
  MakeUnique<wabt::ReturnCallIndirectExpr>();
  GetLocation(&local_c0.loc,this);
  Var::Var(&local_78,sig_index,&local_c0.loc);
  SetFuncDeclaration(this,(FuncDeclaration *)(local_f8 + 1),&local_78);
  Var::~Var(&local_78);
  local_e8.field_1.field_0.line = 0;
  local_e8.field_1._4_8_ = 0;
  local_e8.filename.data_ = (char *)0x0;
  local_e8.filename.size_._0_4_ = 0;
  local_e8.filename.size_._4_4_ = 0;
  Var::Var(&local_c0,table_index,&local_e8);
  Var::operator=((Var *)(local_f8 + 3),&local_c0);
  Var::~Var(&local_c0);
  local_f0._M_head_impl = local_f8;
  RVar1 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_f0);
  if (local_f0._M_head_impl != (Expr *)0x0) {
    (*(local_f0._M_head_impl)->_vptr_Expr[1])();
  }
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnReturnCallIndirectExpr(Index sig_index, Index table_index) {
  auto expr = MakeUnique<ReturnCallIndirectExpr>();
  SetFuncDeclaration(&expr->decl, Var(sig_index, GetLocation()));
  expr->table = Var(table_index);
  return AppendExpr(std::move(expr));
}